

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

string * Pathie::Path::get_xdg_userdir_setting(string *__return_storage_ptr__,string *setting)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  runtime_error *prVar4;
  char *pcVar5;
  size_t sVar6;
  char *__src;
  char *__modes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Path userconfig;
  char line [256];
  char buf [256];
  char result [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1298;
  string local_1278;
  Path local_1258;
  char local_1238 [4];
  char local_1234 [252];
  char local_1138 [256];
  Path local_1038 [128];
  
  pbVar7 = &local_1298;
  config_dir();
  local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1278,"user-dirs.dirs","");
  join(&local_1258,local_1038,&local_1278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
    operator_delete(local_1278._M_dataplus._M_p);
  }
  paVar1 = &local_1038[0].m_path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0].m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_1038[0].m_path._M_dataplus._M_p);
  }
  bVar2 = is_file(&local_1258);
  if (bVar2) {
    __stream = fopen(&local_1258,"r",__modes);
    iVar3 = feof(__stream);
    if (iVar3 == 0) {
      do {
        memset(local_1238,0,0x100);
        memset(local_1138,0,0x100);
        fgets(local_1238,0x100,__stream);
        if ((local_1238[0] != '\n') && (local_1238[0] != '#')) {
          strncpy(local_1138,local_1234,setting->_M_string_length);
          iVar3 = strcmp(local_1138,(setting->_M_dataplus)._M_p);
          if (iVar3 == 0) {
            fclose(__stream);
            pcVar5 = strchr(local_1238,0x22);
            sVar6 = strcspn(pcVar5 + 1,"\"");
            memset(local_1138,0,0x100);
            strncpy(local_1138,pcVar5 + 1,sVar6);
            memset(local_1038,0,0x1000);
            pcVar5 = strstr(local_1138,"$HOME");
            if (pcVar5 == (char *)0x0) {
              pcVar5 = local_1138;
            }
            else {
              __src = getenv("HOME");
              if (__src == (char *)0x0) {
                prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_1298._M_dataplus._M_p = (pointer)&local_1298.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1298,"$HOME not set!","");
                std::runtime_error::runtime_error(prVar4,(string *)&local_1298);
                __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              strncpy((char *)local_1038,local_1138,(long)pcVar5 - (long)local_1138);
              sVar6 = strlen((char *)local_1038);
              strcpy((char *)((long)&local_1038[0].m_path._M_dataplus._M_p + sVar6),__src);
              sVar6 = strlen((char *)local_1038);
              pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&local_1298._M_dataplus._M_p + sVar6);
              pcVar5 = pcVar5 + 5;
            }
            strcpy((char *)((long)pbVar7 + 0x260),pcVar5);
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            sVar6 = strlen((char *)local_1038);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,local_1038,
                       (long)&local_1038[0].m_path._M_dataplus._M_p + sVar6);
            goto LAB_0010c7a0;
          }
        }
        iVar3 = feof(__stream);
      } while (iVar3 == 0);
    }
    fclose(__stream);
    local_1038[0].m_path._M_dataplus._M_p = (pointer)&local_1038[0].m_path.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,"Unknown XDG directory \'","");
    std::operator+(&local_1298,setting,"\' requested.");
    std::__cxx11::string::_M_append((char *)local_1038,(ulong)local_1298._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
      operator_delete(local_1298._M_dataplus._M_p);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,(string *)local_1038);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  home();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_1038[0].m_path._M_dataplus._M_p,
             local_1038[0].m_path._M_dataplus._M_p + local_1038[0].m_path._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0].m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_1038[0].m_path._M_dataplus._M_p);
  }
LAB_0010c7a0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1258.m_path._M_dataplus._M_p != &local_1258.m_path.field_2) {
    operator_delete(local_1258.m_path._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Path::get_xdg_userdir_setting(const std::string& setting)
{
  // XDG user-dirs spec recommends (only) checking for $XDG_CONFIG_HOME/user-dirs.dirs,
  // the files under $XDG_CONFIG_DIRS are not to consider.
  Path userconfig = Path::config_dir().join("user-dirs.dirs");

  if (userconfig.is_file()) {
    FILE* p_file = userconfig.fopen("r");

    char line[256];
    char buf[256];
    bool found = false;
    while (!feof(p_file)) {
      memset(line, 0, 256);
      memset(buf, 0, 256);

      fgets(line, 256, p_file);

      // Ignore comments and empty lines
      if (line[0] == '#' || line[0] == '\n')
        continue;

      // Extract the setting name from the line, e.g. "DOWNLOAD" for
      // "XDG_DOWNLOAD_DIR=...".
      strncpy(buf, line + 4, setting.length()); // +4 for "XDG_"
      if (strcmp(buf, setting.c_str()) == 0) {
        found = true;
        break;
      }
    }

    fclose(p_file);

    // Error out if not found
    if (!found) {
      std::string msg = "Unknown XDG directory '";
      msg += setting + "' requested.";
      throw(std::runtime_error(msg));
    }

    // OK, we have found the correct setting. Extract the value now.
    // »XDG_DOWNLOAD_DIR="$HOME/Downloads"«
    char* start = strchr(line, '"') + 1; // Exclude " itself
    size_t len  = strcspn(start, "\"");

    if (!start) // Malformed
      throw(std::runtime_error("Malformed XDG config file (quote mismatch/missing quotes)!"));

    memset(buf, 0, 256);
    strncpy(buf, start, len);
    // buf now contains the part between the quotes followed by NUL bytes

    char result[PATH_MAX];
    memset(result, 0, PATH_MAX);

    // Replace $HOME with env value of $HOME
    start = strstr(buf, "$HOME");
    if (start) { // Contains $HOME
      char* homestr = getenv("HOME");
      if (!homestr)
        throw(std::runtime_error("$HOME not set!"));

      // Stuff before $HOME
      strncpy(result, buf, ((char*)start) - ((char*)buf)); // Compiler does not allow doing pointer arithmetics with char[], but with char* ??? They should be the same...
      // $HOME replacement
      strcpy(result + strlen(result), homestr);
      // Suff after $HOME ($HOME is exactly 5 chars long)
      strcpy(result + strlen(result), start + 5);
    }
    else { // No $HOME included. Copy everything verbosely.
      strcpy(result, buf);
    }

    // result now holds the final result with lots of NUL bytes at the end.
    return std::string(result);
  }

  // No XDG configuration on this system, use $HOME.
  return Path::home().str();
}